

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::PopValues(Thread *this,ValueTypes *types,Values *out_values)

{
  pointer pTVar1;
  pointer pTVar2;
  long lVar3;
  ulong __new_size;
  
  __new_size = (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  if (__new_size <=
      (ulong)((long)(this->values_).
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->values_).
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (out_values,__new_size);
    pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar3 = (long)pTVar1 -
            (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    pTVar2 = pTVar1;
    if (lVar3 != 0) {
      memmove((out_values->
              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl
              .super__Vector_impl_data._M_start,
              (void *)((long)(this->values_).
                             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar3 * -4),lVar3 * 4);
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (&this->values_,
               ((long)(this->values_).
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->values_).
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) -
               ((long)pTVar1 - (long)pTVar2 >> 2));
    return;
  }
  __assert_fail("values_.size() >= types.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                ,0x3d6,"void wabt::interp::Thread::PopValues(const ValueTypes &, Values *)");
}

Assistant:

void Thread::PopValues(const ValueTypes& types, Values* out_values) {
  assert(values_.size() >= types.size());
  out_values->resize(types.size());
  std::copy(values_.end() - types.size(), values_.end(), out_values->begin());
  values_.resize(values_.size() - types.size());
}